

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::BeginDebugGroup
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,Char *Name,float *pColor,
          int param_3)

{
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  int param_3_local;
  float *pColor_local;
  Char *Name_local;
  DeviceContextBase<Diligent::EngineGLImplTraits> *this_local;
  
  if (Name == (Char *)0x0) {
    msg.field_2._12_4_ = param_3;
    FormatString<char[22]>((string *)local_48,(char (*) [22])"Name must not be null");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"BeginDebugGroup",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x835);
    std::__cxx11::string::~string((string *)local_48);
  }
  this->m_DvpDebugGroupCount = this->m_DvpDebugGroupCount + 1;
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::BeginDebugGroup(const Char* Name, const float* pColor, int)
{
    DEV_CHECK_ERR(Name != nullptr, "Name must not be null");
#ifdef DILIGENT_DEVELOPMENT
    ++m_DvpDebugGroupCount;
#endif
}